

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O2

void xmlSAX2InitHtmlDefaultSAXHandler(xmlSAXHandler *hdlr)

{
  if ((hdlr != (xmlSAXHandler *)0x0) && (hdlr->initialized == 0)) {
    hdlr->internalSubset = xmlSAX2InternalSubset;
    hdlr->externalSubset = (externalSubsetSAXFunc)0x0;
    hdlr->isStandalone = (isStandaloneSAXFunc)0x0;
    hdlr->hasInternalSubset = (hasInternalSubsetSAXFunc)0x0;
    hdlr->hasExternalSubset = (hasExternalSubsetSAXFunc)0x0;
    hdlr->resolveEntity = (resolveEntitySAXFunc)0x0;
    hdlr->getEntity = xmlSAX2GetEntity;
    hdlr->getParameterEntity = (getParameterEntitySAXFunc)0x0;
    hdlr->entityDecl = (entityDeclSAXFunc)0x0;
    hdlr->notationDecl = (notationDeclSAXFunc)0x0;
    hdlr->attributeDecl = (attributeDeclSAXFunc)0x0;
    hdlr->elementDecl = (elementDeclSAXFunc)0x0;
    hdlr->unparsedEntityDecl = (unparsedEntityDeclSAXFunc)0x0;
    hdlr->setDocumentLocator = xmlSAX2SetDocumentLocator;
    hdlr->startDocument = xmlSAX2StartDocument;
    hdlr->endDocument = xmlSAX2EndDocument;
    hdlr->startElement = xmlSAX2StartElement;
    hdlr->endElement = xmlSAX2EndElement;
    hdlr->reference = (referenceSAXFunc)0x0;
    hdlr->characters = xmlSAX2Characters;
    hdlr->cdataBlock = xmlSAX2CDataBlock;
    hdlr->ignorableWhitespace = xmlSAX2IgnorableWhitespace;
    hdlr->processingInstruction = xmlSAX2ProcessingInstruction;
    hdlr->comment = xmlSAX2Comment;
    hdlr->warning = xmlParserWarning;
    hdlr->error = xmlParserError;
    hdlr->fatalError = xmlParserError;
    hdlr->initialized = 1;
    return;
  }
  return;
}

Assistant:

void
xmlSAX2InitHtmlDefaultSAXHandler(xmlSAXHandler *hdlr)
{
    if ((hdlr == NULL) || (hdlr->initialized != 0))
	return;

    hdlr->internalSubset = xmlSAX2InternalSubset;
    hdlr->externalSubset = NULL;
    hdlr->isStandalone = NULL;
    hdlr->hasInternalSubset = NULL;
    hdlr->hasExternalSubset = NULL;
    hdlr->resolveEntity = NULL;
    hdlr->getEntity = xmlSAX2GetEntity;
    hdlr->getParameterEntity = NULL;
    hdlr->entityDecl = NULL;
    hdlr->attributeDecl = NULL;
    hdlr->elementDecl = NULL;
    hdlr->notationDecl = NULL;
    hdlr->unparsedEntityDecl = NULL;
    hdlr->setDocumentLocator = xmlSAX2SetDocumentLocator;
    hdlr->startDocument = xmlSAX2StartDocument;
    hdlr->endDocument = xmlSAX2EndDocument;
    hdlr->startElement = xmlSAX2StartElement;
    hdlr->endElement = xmlSAX2EndElement;
    hdlr->reference = NULL;
    hdlr->characters = xmlSAX2Characters;
    hdlr->cdataBlock = xmlSAX2CDataBlock;
    hdlr->ignorableWhitespace = xmlSAX2IgnorableWhitespace;
    hdlr->processingInstruction = xmlSAX2ProcessingInstruction;
    hdlr->comment = xmlSAX2Comment;
    hdlr->warning = xmlParserWarning;
    hdlr->error = xmlParserError;
    hdlr->fatalError = xmlParserError;

    hdlr->initialized = 1;
}